

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.cpp
# Opt level: O1

int main(void)

{
  Move move;
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  char *pcVar4;
  double dVar5;
  NimState state;
  undefined1 in_stack_000000b0 [24];
  NimState local_68;
  undefined8 local_60;
  NimState in_stack_ffffffffffffffa8;
  undefined1 auStack_50 [8];
  undefined8 local_48 [3];
  
  local_68.player_to_move = 1;
  local_68.chips = 0xf;
  NimState::check_invariant(&local_68);
  if (0 < local_68.chips) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"State: ",7);
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_68.player_to_move);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      if (local_68.player_to_move == 1) {
        local_48[0] = 0x186a000000008;
        puVar2 = local_48;
      }
      else {
        local_60 = 0x271000000008;
        puVar2 = &local_60;
      }
      puVar2[1] = 0xbff0000000000000;
      *(undefined1 *)(puVar2 + 2) = 1;
      move = MCTS::compute_move<NimState>
                       (in_stack_ffffffffffffffa8,(ComputeOptions)in_stack_000000b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Best move: ",0xb);
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,move);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      NimState::do_move(&local_68,move);
      NimState::check_invariant(&local_68);
    } while (0 < local_68.chips);
  }
  dVar5 = NimState::get_result(&local_68,2);
  if ((dVar5 != 1.0) || (NAN(dVar5))) {
    dVar5 = NimState::get_result(&local_68,1);
    if ((dVar5 != 1.0) || (NAN(dVar5))) {
      pcVar4 = "Nobody wins!";
      lVar3 = 0xc;
      goto LAB_001097e6;
    }
    pcVar4 = "Player 2 wins!";
  }
  else {
    pcVar4 = "Player 1 wins!";
  }
  lVar3 = 0xe;
LAB_001097e6:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
	using namespace std;

	MCTS::ComputeOptions player1_options, player2_options;
	player1_options.max_iterations = 100000;
	player1_options.verbose = true;
	player2_options.max_iterations =  10000;
	player2_options.verbose = true;

	NimState state(15);
	while (state.has_moves()) {
		cout << "State: " << state.player_to_move << endl;
		NimState::Move move;
		if (state.player_to_move == 1) {
			move = MCTS::compute_move(state, player1_options);
		}
		else {
			move = MCTS::compute_move(state, player2_options);
		}

		cout << "Best move: " << move << endl;
		state.do_move(move);
	}
	if (state.get_result(2) == 1.0) {
		cout << "Player 1 wins!" << endl;
	}
	else if (state.get_result(1) == 1.0) {
		cout << "Player 2 wins!" << endl;
	}
	else {
		cout << "Nobody wins!" << endl;
	}
}